

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.h
# Opt level: O2

void __thiscall ExttposeArgument::parse_args(ExttposeArgument *this,int argc,char **argv)

{
  string *__rhs;
  string *__lhs;
  byte bVar1;
  bool bVar2;
  runtime_error *prVar3;
  long lVar4;
  initializer_list<const_char_*const> init_list;
  allocator local_339;
  string local_338;
  ifstream inconff;
  byte abStack_2f0 [488];
  parser cmdl;
  
  argh::parser::parser(&cmdl,argc,argv,2);
  local_338.field_2._M_allocated_capacity = (long)"getconf needs valid value of -i and -o" + 0x25;
  local_338._M_dataplus._M_p = "s";
  local_338._M_string_length = 0x11d005;
  init_list._M_len = 3;
  init_list._M_array = (iterator)&local_338;
  argh::parser::operator()((string_stream *)&inconff,&cmdl,init_list);
  bVar1 = abStack_2f0[*(long *)(_inconff + -0x18)];
  std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
  if ((bVar1 & 5) != 0) {
    std::operator<<((ostream *)&std::cerr,"usage: exttpose [OPTION]... -i<infile> -o<outfile> -s\n")
    ;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"exttpose needs valid value of -i -o and -s");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_338,"i",&local_339);
  argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
  __lhs = &this->name;
  std::operator>>((istream *)&inconff,(string *)__lhs);
  std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
  std::__cxx11::string::~string((string *)&local_338);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inconff,__lhs
                 ,".data");
  std::__cxx11::string::operator=((string *)this,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inconff,__lhs
                 ,".conf");
  __rhs = &this->inconfn;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  std::__cxx11::string::string((string *)&local_338,"o",&local_339);
  argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
  std::operator>>((istream *)&inconff,(string *)__lhs);
  std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
  std::__cxx11::string::~string((string *)&local_338);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inconff,__lhs
                 ,".tpose");
  std::__cxx11::string::operator=((string *)&this->output,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inconff,__lhs
                 ,".idx");
  std::__cxx11::string::operator=((string *)&this->idxfn,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inconff,__lhs
                 ,".2it");
  std::__cxx11::string::operator=((string *)&this->it2fn,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inconff,__lhs
                 ,".2seq");
  std::__cxx11::string::operator=((string *)&this->seqfn,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inconff,__lhs
                 ,".tmp");
  std::__cxx11::string::operator=((string *)&this->tmpfn,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  std::__cxx11::string::string((string *)&local_338,"p",&local_339);
  argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
  std::istream::operator>>((istream *)&inconff,&this->num_partitions);
  std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::string((string *)&local_338,"s",&local_339);
  argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
  std::istream::_M_extract<double>((double *)&inconff);
  std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::string((string *)&local_338,"a",&local_339);
  argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
  bVar1 = abStack_2f0[*(long *)(_inconff + -0x18)];
  std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
  std::__cxx11::string::~string((string *)&local_338);
  if ((bVar1 & 5) == 0) {
    this->use_seq = 0;
    std::__cxx11::string::string((string *)&local_338,"a",&local_339);
    argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
    std::istream::operator>>((istream *)&inconff,&this->write_only_fcnt);
    std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
    std::__cxx11::string::~string((string *)&local_338);
  }
  std::__cxx11::string::string((string *)&inconff,"d",(allocator *)&local_338);
  bVar2 = argh::parser::got_flag(&cmdl,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  if (bVar2) {
    this->use_diff = '\x01';
  }
  std::__cxx11::string::string((string *)&inconff,"l",(allocator *)&local_338);
  bVar2 = argh::parser::got_flag(&cmdl,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  if (bVar2) {
    this->do_l2 = 0;
  }
  std::__cxx11::string::string((string *)&inconff,"v",(allocator *)&local_338);
  bVar2 = argh::parser::got_flag(&cmdl,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  if (bVar2) {
    this->do_invert = 0;
  }
  std::__cxx11::string::string((string *)&inconff,"f",(allocator *)&local_338);
  bVar2 = argh::parser::got_flag(&cmdl,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  if (bVar2) {
    this->use_newformat = '\0';
  }
  std::__cxx11::string::string((string *)&local_338,"m",&local_339);
  argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
  bVar1 = abStack_2f0[*(long *)(_inconff + -0x18)];
  std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
  std::__cxx11::string::~string((string *)&local_338);
  if ((bVar1 & 5) == 0) {
    std::__cxx11::string::string((string *)&local_338,"m",&local_339);
    argh::parser::operator()((string_stream *)&inconff,&cmdl,&local_338);
    std::istream::_M_extract<long>((long *)&inconff);
    std::__cxx11::istringstream::~istringstream((istringstream *)&inconff);
    std::__cxx11::string::~string((string *)&local_338);
    this->AMEM = this->AMEM * 0x12d000;
  }
  std::__cxx11::string::string((string *)&inconff,"x",(allocator *)&local_338);
  bVar2 = argh::parser::got_flag(&cmdl,(string *)&inconff);
  std::__cxx11::string::~string((string *)&inconff);
  if (bVar2) {
    this->no_minus_off = '\x01';
  }
  std::ifstream::ifstream(&inconff,(string *)__rhs,_S_bin);
  if ((abStack_2f0[*(long *)(_inconff + -0x18)] & 5) == 0) {
    if (this->use_seq == 0) {
      std::istream::read((char *)&inconff,(long)&this->DBASE_NUM_TRANS);
      std::istream::read((char *)&inconff,(long)&this->DBASE_MAXITEM);
      lVar4 = 0x114;
    }
    else {
      std::istream::read((char *)&inconff,(long)&this->DBASE_NUM_TRANS);
      std::istream::read((char *)&inconff,(long)&this->DBASE_MAXITEM);
      std::istream::read((char *)&inconff,(long)&this->DBASE_AVG_CUST_SZ);
      lVar4 = 0x11c;
      std::istream::read((char *)&inconff,(long)&this->DBASE_AVG_TRANS_SZ);
    }
    std::istream::read((char *)&inconff,(long)&(this->input)._M_dataplus._M_p + lVar4);
    if (this->use_diff == '\0') {
      if (this->use_seq != 0) {
        this->write_only_fcnt = 0;
      }
    }
    else {
      this->use_seq = 0;
      this->num_partitions = 1;
    }
    std::ifstream::~ifstream(&inconff);
    argh::parser::~parser(&cmdl);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_338,"ERROR: Can\'t read conf file: ",__rhs);
  std::runtime_error::runtime_error(prVar3,(string *)&local_338);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_args(int argc, char **argv) {
        auto cmdl = argh::parser(argc, argv, argh::parser::PREFER_PARAM_FOR_UNREG_OPTION);
        if (!cmdl({"s", "i", "o"})) {
            cerr << "usage: exttpose [OPTION]... -i<infile> -o<outfile> -s\n";
            throw runtime_error("exttpose needs valid value of -i -o and -s");
        }
        cmdl("i") >> name;
        input = name + ".data";
        inconfn = name + ".conf";
        cmdl("o") >> name;
        output = name + ".tpose";
        idxfn = name + ".idx";
        it2fn = name + ".2it";
        seqfn = name + ".2seq";
        tmpfn = name + ".tmp";
        cmdl("p") >> num_partitions;
        cmdl("s") >> MINSUP_PER;
        if (cmdl("a")) {
            use_seq = 0;
            cmdl("a") >> write_only_fcnt;
        }
        if (cmdl["d"]) use_diff = 1;
        if (cmdl["l"]) do_l2 = 0;
        if (cmdl["v"]) do_invert = 0;
        if (cmdl["f"]) use_newformat = 0;
        if (cmdl("m")) {
            cmdl("m") >> AMEM;
            AMEM *= MEG;
        }
        if (cmdl["x"]) no_minus_off = 1;

        ifstream inconff(inconfn, ios::binary);
        if (!inconff) {
            throw runtime_error("ERROR: Can\'t read conf file: " + inconfn);
        }

        if (use_seq) {
            inconff.read((char *) &DBASE_NUM_TRANS, INT_SIZE);
            inconff.read((char *) &DBASE_MAXITEM, INT_SIZE);
            inconff.read((char *) &DBASE_AVG_CUST_SZ, sizeof(float));
            inconff.read((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
            inconff.read((char *) &DBASE_TOT_TRANS, INT_SIZE);
        } else {
            inconff.read((char *) &DBASE_NUM_TRANS, INT_SIZE);
            inconff.read((char *) &DBASE_MAXITEM, INT_SIZE);
            inconff.read((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        }

        if (use_diff) {
            use_seq = 0;
            num_partitions = 1;
        }
        if (use_seq) {
            write_only_fcnt = 0;
        }
    }